

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeRollback(Btree *p,int tripCode,int writeOnly)

{
  BtShared *pBt;
  MemPage *pPage;
  int iVar1;
  int extraout_EAX;
  long in_FS_OFFSET;
  MemPage *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if (tripCode == 0) {
    writeOnly = 0;
    tripCode = saveAllCursors(pBt,0,(BtCursor *)0x0);
    if (tripCode == 0) goto LAB_00122cd1;
  }
  sqlite3BtreeTripAllCursors(p,tripCode,writeOnly);
LAB_00122cd1:
  if (p->inTrans == '\x02') {
    local_30 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
    sqlite3PagerRollback(pBt->pPager);
    iVar1 = btreeGetPage(pBt,1,&local_30,0);
    pPage = local_30;
    if (iVar1 == 0) {
      btreeSetNPage(pBt,local_30);
      releasePageOne(pPage);
    }
    pBt->inTransaction = '\x01';
    btreeClearHasContent(pBt);
  }
  btreeEndTransaction(p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    sqlite3BtreeLeave(p);
    return extraout_EAX;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeRollback(Btree *p, int tripCode, int writeOnly){
  int rc;
  BtShared *pBt = p->pBt;
  MemPage *pPage1;

  assert( writeOnly==1 || writeOnly==0 );
  assert( tripCode==SQLITE_ABORT_ROLLBACK || tripCode==SQLITE_OK );
  sqlite3BtreeEnter(p);
  if( tripCode==SQLITE_OK ){
    rc = tripCode = saveAllCursors(pBt, 0, 0);
    if( rc ) writeOnly = 0;
  }else{
    rc = SQLITE_OK;
  }
  if( tripCode ){
    int rc2 = sqlite3BtreeTripAllCursors(p, tripCode, writeOnly);
    assert( rc==SQLITE_OK || (writeOnly==0 && rc2==SQLITE_OK) );
    if( rc2!=SQLITE_OK ) rc = rc2;
  }
  btreeIntegrity(p);

  if( p->inTrans==TRANS_WRITE ){
    int rc2;

    assert( TRANS_WRITE==pBt->inTransaction );
    rc2 = sqlite3PagerRollback(pBt->pPager);
    if( rc2!=SQLITE_OK ){
      rc = rc2;
    }

    /* The rollback may have destroyed the pPage1->aData value.  So
    ** call btreeGetPage() on page 1 again to make
    ** sure pPage1->aData is set correctly. */
    if( btreeGetPage(pBt, 1, &pPage1, 0)==SQLITE_OK ){
      btreeSetNPage(pBt, pPage1);
      releasePageOne(pPage1);
    }
    assert( countValidCursors(pBt, 1)==0 );
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return rc;
}